

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInterface.cpp
# Opt level: O1

void __thiscall
Rml::SystemInterface::JoinPath
          (SystemInterface *this,String *translated_path,String *document_path,String *path)

{
  size_type *psVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  char cVar9;
  URL url;
  String local_240;
  String local_220;
  String local_200;
  String local_1e0;
  String local_1c0;
  String local_1a0;
  String local_180;
  URL local_160;
  
  if ((path->_M_string_length != 0) && (*(path->_M_dataplus)._M_p == '/')) {
    ::std::__cxx11::string::substr((ulong)&local_160,(ulong)path);
    ::std::__cxx11::string::operator=((string *)translated_path,(string *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.url._M_dataplus._M_p == &local_160.url.field_2) {
      return;
    }
    operator_delete(local_160.url._M_dataplus._M_p,local_160.url.field_2._M_allocated_capacity + 1);
    return;
  }
  cVar9 = (char)path;
  uVar3 = ::std::__cxx11::string::find(cVar9,0x3a);
  uVar4 = ::std::__cxx11::string::find(cVar9,0x2f);
  uVar5 = ::std::__cxx11::string::find(cVar9,0x5c);
  if (uVar4 < uVar5) {
    uVar5 = uVar4;
  }
  if (uVar3 < uVar5) {
    ::std::__cxx11::string::_M_assign((string *)translated_path);
    return;
  }
  ::std::__cxx11::string::_M_assign((string *)translated_path);
  pcVar2 = (translated_path->_M_dataplus)._M_p;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,pcVar2,pcVar2 + translated_path->_M_string_length);
  StringUtilities::Replace(&local_160.url,&local_180,'\\','/');
  ::std::__cxx11::string::operator=((string *)translated_path,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.url._M_dataplus._M_p != &local_160.url.field_2) {
    operator_delete(local_160.url._M_dataplus._M_p,local_160.url.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  lVar6 = ::std::__cxx11::string::rfind((char)translated_path,0x2f);
  if (lVar6 == -1) {
    translated_path->_M_string_length = 0;
    *(translated_path->_M_dataplus)._M_p = '\0';
  }
  else {
    ::std::__cxx11::string::resize((ulong)translated_path,(char)lVar6 + '\x01');
  }
  pcVar2 = (translated_path->_M_dataplus)._M_p;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,pcVar2,pcVar2 + translated_path->_M_string_length);
  StringUtilities::Replace(&local_200,&local_1a0,':','|');
  pcVar2 = (path->_M_dataplus)._M_p;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar2,pcVar2 + path->_M_string_length);
  StringUtilities::Replace(&local_220,&local_1e0,'\\','/');
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    uVar8 = local_200.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_220._M_string_length + local_200._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      uVar8 = local_220.field_2._M_allocated_capacity;
    }
    if (local_220._M_string_length + local_200._M_string_length <= (ulong)uVar8) {
      puVar7 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_220,0,(char *)0x0,(ulong)local_200._M_dataplus._M_p);
      goto LAB_0028b874;
    }
  }
  puVar7 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_220._M_dataplus._M_p);
LAB_0028b874:
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  psVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_240.field_2._M_allocated_capacity = *psVar1;
    local_240.field_2._8_8_ = puVar7[3];
  }
  else {
    local_240.field_2._M_allocated_capacity = *psVar1;
    local_240._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_240._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  URL::URL(&local_160,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  URL::GetPathedFileName_abi_cxx11_(&local_1c0,&local_160);
  StringUtilities::Replace(&local_240,&local_1c0,'|',':');
  ::std::__cxx11::string::operator=((string *)translated_path,(string *)&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  URL::~URL(&local_160);
  return;
}

Assistant:

void SystemInterface::JoinPath(String& translated_path, const String& document_path, const String& path)
{
	// If the path is absolute, strip the leading / and return it.
	if (path.size() > 0 && path[0] == '/')
	{
		translated_path = path.substr(1);
		return;
	}

	// If the path is a Windows-style absolute path, return it directly.
	size_t drive_pos = path.find(':');
	size_t slash_pos = Math::Min(path.find('/'), path.find('\\'));
	if (drive_pos != String::npos && drive_pos < slash_pos)
	{
		translated_path = path;
		return;
	}

	using StringUtilities::Replace;

	// Strip off the referencing document name.
	translated_path = document_path;
	translated_path = Replace(translated_path, '\\', '/');
	size_t file_start = translated_path.rfind('/');
	if (file_start != String::npos)
		translated_path.resize(file_start + 1);
	else
		translated_path.clear();

	// Append the paths and send through URL to removing any '..'.
	URL url(Replace(translated_path, ':', '|') + Replace(path, '\\', '/'));
	translated_path = Replace(url.GetPathedFileName(), '|', ':');
}